

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

int pythonDbusPresent(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  char lPythonParams [256];
  char lPythonCommand [384];
  
  memcpy(lPythonParams,
         "-c \"try:\n\timport dbus;bus=dbus.SessionBus();notif=bus.get_object(\'org.freedesktop.Notifications\',\'/org/freedesktop/Notifications\');notify=dbus.Interface(notif,\'org.freedesktop.Notifications\');\nexcept:\n\tprint(0);\""
         ,0x100);
  if (pythonDbusPresent::lPythonDbusPresent < 0) {
    pythonDbusPresent::lPythonDbusPresent = 0;
    iVar1 = python2Present();
    if (iVar1 != 0) {
      strcpy(gPythonName,gPython2Name);
      sprintf(lPythonCommand,"%s %s",gPythonName,lPythonParams);
      pythonDbusPresent::lPythonDbusPresent = tryCommand(lPythonCommand);
    }
    if ((pythonDbusPresent::lPythonDbusPresent == 0) && (iVar1 = python3Present(), iVar1 != 0)) {
      strcpy(gPythonName,gPython3Name);
      sprintf(lPythonCommand,"%s %s",gPythonName,lPythonParams);
      pythonDbusPresent::lPythonDbusPresent = tryCommand(lPythonCommand);
    }
    if ((tinyfd_verbose != 0) &&
       (printf("lPythonDbusPresent %d\n",(ulong)(uint)pythonDbusPresent::lPythonDbusPresent),
       tinyfd_verbose != 0)) {
      printf("gPythonName %s\n",gPythonName);
    }
  }
  uVar3 = 0;
  if ((pythonDbusPresent::lPythonDbusPresent != 0) && (iVar1 = graphicMode(), iVar1 != 0)) {
    iVar1 = tfd_isDarwin();
    if (iVar1 == 0) {
      uVar3 = 1;
    }
    else {
      pcVar2 = getenv("SSH_TTY");
      uVar3 = (uint)(pcVar2 == (char *)0x0);
    }
  }
  return uVar3;
}

Assistant:

static int pythonDbusPresent(void)
{
    static int lPythonDbusPresent = -1 ;
        char lPythonCommand[384];
        char lPythonParams[256] =
"-c \"try:\n\timport dbus;bus=dbus.SessionBus();\
notif=bus.get_object('org.freedesktop.Notifications','/org/freedesktop/Notifications');\
notify=dbus.Interface(notif,'org.freedesktop.Notifications');\nexcept:\n\tprint(0);\"";

        if (lPythonDbusPresent < 0 )
        {
           lPythonDbusPresent = 0 ;
                if ( python2Present() )
                {
                        strcpy(gPythonName , gPython2Name ) ;
                        sprintf( lPythonCommand , "%s %s" , gPythonName , lPythonParams ) ;
                        lPythonDbusPresent = tryCommand(lPythonCommand) ;
                }

                if ( !lPythonDbusPresent && python3Present() )
                {
                        strcpy(gPythonName , gPython3Name ) ;
                        sprintf( lPythonCommand , "%s %s" , gPythonName , lPythonParams ) ;
                        lPythonDbusPresent = tryCommand(lPythonCommand) ;
                }

                if (tinyfd_verbose) printf("lPythonDbusPresent %d\n", lPythonDbusPresent) ;
                if (tinyfd_verbose) printf("gPythonName %s\n", gPythonName) ;
        }
        return lPythonDbusPresent && graphicMode() && !(tfd_isDarwin() && getenv("SSH_TTY") );
}